

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArrayIndexEnumerator.cpp
# Opt level: O0

JavascriptString * __thiscall
Js::TypedArrayIndexEnumerator::MoveAndGetNext
          (TypedArrayIndexEnumerator *this,PropertyId *propertyId,PropertyAttributes *attributes)

{
  Type TVar1;
  uint uVar2;
  uint32 uVar3;
  ScriptContext *this_00;
  TypedArrayBase *this_01;
  JavascriptString *pJVar4;
  uint32 lastIndex;
  ScriptContext *scriptContext;
  PropertyAttributes *attributes_local;
  PropertyId *propertyId_local;
  TypedArrayIndexEnumerator *this_local;
  
  *propertyId = -1;
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  if ((this->doneArray & 1U) == 0) {
    TVar1 = this->index;
    this->index = this->index + 1;
    uVar2 = this->index;
    this_01 = Memory::WriteBarrierPtr<Js::TypedArrayBase>::operator->(&this->typedArrayObject);
    uVar3 = ArrayObject::GetLength((ArrayObject *)this_01);
    if (uVar2 < uVar3) {
      if (attributes != (PropertyAttributes *)0x0) {
        *attributes = '\x01';
      }
      pJVar4 = ScriptContext::GetIntegerString(this_00,this->index);
      return pJVar4;
    }
    this->index = TVar1;
    this->doneArray = true;
  }
  return (JavascriptString *)0x0;
}

Assistant:

JavascriptString * TypedArrayIndexEnumerator::MoveAndGetNext(PropertyId& propertyId, PropertyAttributes* attributes)
    {
        // TypedArrayIndexEnumerator follows the same logic in JavascriptArrayEnumerator,
        // but the implementation is slightly different as we don't have sparse array
        // in typed array, and typed array is a DynamicObject instead of JavascriptArray.
        propertyId = Constants::NoProperty;
        ScriptContext *scriptContext = this->GetScriptContext();

        if (!doneArray)
        {
            while (true)
            {
                uint32 lastIndex = index;
                index++;
                if ((uint32)index >= typedArrayObject->GetLength()) // End of array
                {
                    index = lastIndex;
                    doneArray = true;
                    break;
                }

                if (attributes != nullptr)
                {
                    *attributes = PropertyEnumerable;
                }

                return scriptContext->GetIntegerString(index);
            }
        }
        return nullptr;
    }